

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O3

FT_Error FT_GlyphLoader_CheckPoints(FT_GlyphLoader loader,FT_UInt n_points,FT_UInt n_contours)

{
  FT_Error FVar1;
  ulong uVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  short *psVar5;
  FT_Memory memory;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong cur_count;
  FT_Error error;
  FT_Error local_50;
  FT_UInt local_4c;
  FT_Memory local_48;
  ulong local_40;
  FT_Error local_34;
  
  memory = loader->memory;
  local_50 = 0;
  uVar6 = (int)(loader->base).outline.n_points + n_points + (int)(loader->current).outline.n_points;
  uVar8 = loader->max_points;
  cur_count = (ulong)uVar8;
  if (uVar8 < uVar6) {
    if (0x7fff < uVar6 + 7) {
      return 10;
    }
    uVar7 = uVar6 + 7 & 0xfffffff8;
    local_40 = (ulong)uVar7;
    local_4c = n_contours;
    pFVar3 = (FT_Vector *)
             ft_mem_realloc(memory,0x10,cur_count,local_40,(loader->base).outline.points,&local_50);
    uVar2 = local_40;
    (loader->base).outline.points = pFVar3;
    if (local_50 != 0) goto LAB_0013242e;
    local_34 = 0;
    local_48 = memory;
    pcVar4 = (char *)ft_mem_qrealloc(memory,1,cur_count,local_40,(loader->base).outline.tags,
                                     &local_34);
    if (uVar8 < uVar7 && local_34 == 0) {
      memset(pcVar4 + cur_count,0,uVar2 - cur_count);
      local_50 = 0;
      (loader->base).outline.tags = pcVar4;
    }
    else {
      local_50 = local_34;
      (loader->base).outline.tags = pcVar4;
      if (local_34 != 0) goto LAB_0013242e;
    }
    if (loader->use_extra != '\0') {
      pFVar3 = (FT_Vector *)
               ft_mem_realloc(local_48,0x10,(ulong)(uVar8 * 2),(ulong)(uVar7 * 2),
                              (loader->base).extra_points,&local_50);
      (loader->base).extra_points = pFVar3;
      if (local_50 != 0) goto LAB_0013242e;
      memmove(pFVar3 + uVar2,pFVar3 + cur_count,cur_count * 0x10);
      (loader->base).extra_points2 = (loader->base).extra_points + uVar2;
    }
    loader->max_points = uVar7;
    uVar7 = loader->max_contours;
    uVar9 = (int)(loader->base).outline.n_contours + local_4c +
            (int)(loader->current).outline.n_contours;
    memory = local_48;
    if (uVar9 <= uVar7) {
      if (uVar6 <= uVar8) {
        return 0;
      }
      goto LAB_001323dd;
    }
  }
  else {
    uVar7 = loader->max_contours;
    uVar9 = (int)(loader->base).outline.n_contours + n_contours +
            (int)(loader->current).outline.n_contours;
    if (uVar9 <= uVar7) {
      return 0;
    }
  }
  if (0x7fff < uVar9 + 3) {
    return 10;
  }
  uVar8 = uVar9 + 3 & 0xfffffffc;
  psVar5 = (short *)ft_mem_realloc(memory,2,(ulong)uVar7,(ulong)uVar8,
                                   (loader->base).outline.contours,&local_50);
  (loader->base).outline.contours = psVar5;
  if (local_50 == 0) {
    loader->max_contours = uVar8;
LAB_001323dd:
    FT_GlyphLoader_Adjust_Points(loader);
    return 0;
  }
LAB_0013242e:
  FVar1 = local_50;
  FT_GlyphLoader_Reset(loader);
  return FVar1;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CheckPoints( FT_GlyphLoader  loader,
                              FT_UInt         n_points,
                              FT_UInt         n_contours )
  {
    FT_Memory    memory  = loader->memory;
    FT_Error     error   = FT_Err_Ok;
    FT_Outline*  base    = &loader->base.outline;
    FT_Outline*  current = &loader->current.outline;
    FT_Bool      adjust  = 0;

    FT_UInt      new_max, old_max;


    /* check points & tags */
    new_max = (FT_UInt)base->n_points + (FT_UInt)current->n_points +
              n_points;
    old_max = loader->max_points;

    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 8 );

      if ( new_max > FT_OUTLINE_POINTS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->points, old_max, new_max ) ||
           FT_RENEW_ARRAY( base->tags,   old_max, new_max ) )
        goto Exit;

      if ( loader->use_extra )
      {
        if ( FT_RENEW_ARRAY( loader->base.extra_points,
                             old_max * 2, new_max * 2 ) )
          goto Exit;

        FT_ARRAY_MOVE( loader->base.extra_points + new_max,
                       loader->base.extra_points + old_max,
                       old_max );

        loader->base.extra_points2 = loader->base.extra_points + new_max;
      }

      adjust = 1;
      loader->max_points = new_max;
    }

    /* check contours */
    old_max = loader->max_contours;
    new_max = (FT_UInt)base->n_contours + (FT_UInt)current->n_contours +
              n_contours;
    if ( new_max > old_max )
    {
      new_max = FT_PAD_CEIL( new_max, 4 );

      if ( new_max > FT_OUTLINE_CONTOURS_MAX )
        return FT_THROW( Array_Too_Large );

      if ( FT_RENEW_ARRAY( base->contours, old_max, new_max ) )
        goto Exit;

      adjust = 1;
      loader->max_contours = new_max;
    }

    if ( adjust )
      FT_GlyphLoader_Adjust_Points( loader );

  Exit:
    if ( error )
      FT_GlyphLoader_Reset( loader );

    return error;
  }